

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O2

bool isValidHttpHeaderValueField(QAnyStringView value)

{
  bool bVar1;
  bool bVar2;
  long in_FS_OFFSET;
  char local_58 [24];
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = std::all_of<char_const*,__9>
                    (value.field_0.m_data,
                     (value.m_size & 0x3fffffffffffffff) + (long)value.field_0.m_data);
  bVar2 = true;
  if (!bVar1) {
    lcQHttpHeaders();
    if (((byte)lcQHttpHeaders::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) == 0
       ) {
      bVar2 = false;
    }
    else {
      local_58[0] = '\x02';
      local_58[1] = '\0';
      local_58[2] = '\0';
      local_58[3] = '\0';
      local_58[4] = '\0';
      local_58[5] = '\0';
      local_58[6] = '\0';
      local_58[7] = '\0';
      local_58[8] = '\0';
      local_58[9] = '\0';
      local_58[10] = '\0';
      local_58[0xb] = '\0';
      local_58[0xc] = '\0';
      local_58[0xd] = '\0';
      local_58[0xe] = '\0';
      local_58[0xf] = '\0';
      local_58[0x10] = '\0';
      local_58[0x11] = '\0';
      local_58[0x12] = '\0';
      local_58[0x13] = '\0';
      local_58[0x14] = '\0';
      local_58[0x15] = '\0';
      local_58[0x16] = '\0';
      local_58[0x17] = '\0';
      local_40 = lcQHttpHeaders::category.name;
      bVar2 = false;
      QMessageLogger::warning(local_58,"HTTP header value contained illegal character(s)");
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

static bool isValidHttpHeaderValueField(QAnyStringView value) noexcept
{
    const bool valid = value.visit([](auto value){ return headerValueValidImpl(value); });
    if (!valid)
        qCWarning(lcQHttpHeaders, "HTTP header value contained illegal character(s)");
    return valid;
}